

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

Cluster * __thiscall mkvparser::Segment::FindOrPreloadCluster(Segment *this,longlong requested_pos)

{
  Cluster **ppCVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Cluster *pCVar4;
  Cluster **ppCVar5;
  long lVar6;
  Cluster **ppCVar7;
  
  if (requested_pos < 0) {
LAB_00152aee:
    pCVar4 = (Cluster *)0x0;
  }
  else {
    ppCVar7 = this->m_clusters;
    ppCVar5 = ppCVar7 + this->m_clusterCount + this->m_clusterPreloadCount;
    do {
      while( true ) {
        if (ppCVar5 <= ppCVar7) {
          pCVar4 = Cluster::Create(this,-1,requested_pos);
          if (pCVar4 != (Cluster *)0x0) {
            bVar3 = PreloadCluster(this,pCVar4,(long)ppCVar7 - (long)this->m_clusters >> 3);
            if (bVar3) {
              return pCVar4;
            }
            Cluster::~Cluster(pCVar4);
            operator_delete(pCVar4);
          }
          goto LAB_00152aee;
        }
        auVar2._8_8_ = (long)ppCVar5 - (long)ppCVar7 >> 0x3f;
        auVar2._0_8_ = (long)ppCVar5 - (long)ppCVar7 >> 3;
        ppCVar1 = ppCVar7 + SUB168(auVar2 / SEXT816(2),0);
        pCVar4 = *ppCVar1;
        lVar6 = pCVar4->m_element_start - pCVar4->m_pSegment->m_start;
        if (requested_pos <= lVar6) break;
        ppCVar7 = ppCVar1 + 1;
      }
      ppCVar5 = ppCVar1;
    } while (requested_pos < lVar6);
  }
  return pCVar4;
}

Assistant:

const Cluster* Segment::FindOrPreloadCluster(long long requested_pos) {
  if (requested_pos < 0)
    return 0;

  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < requested_pos)
      i = k + 1;
    else if (pos > requested_pos)
      j = k;
    else
      return pCluster;
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, requested_pos);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster;
}